

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  vfloat<4> vVar2;
  BVH *bvh;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  undefined4 uVar9;
  long lVar10;
  ulong uVar11;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar12;
  NodeRef root;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  NodeRef *pNVar20;
  uint uVar21;
  bool bVar22;
  byte bVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar44;
  int iVar45;
  int iVar46;
  vint4 ai_2;
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  vint4 bi;
  undefined1 in_ZMM2 [64];
  vint4 bi_1;
  vint4 bi_3;
  vint4 ai;
  vint4 bi_2;
  vint4 ai_1;
  undefined1 auVar49 [16];
  vint4 ai_3;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  Precalculations pre;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar27 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar47 = ZEXT816(0) << 0x40;
    uVar6 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar47,5);
    uVar24 = vpcmpeqd_avx512vl(auVar27,(undefined1  [16])valid_i->field_0);
    uVar24 = ((byte)uVar6 & 0xf) & uVar24;
    bVar23 = (byte)uVar24;
    if (bVar23 != 0) {
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x40))->v;
      tray.dir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x50))->v;
      tray.dir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x60))->v;
      auVar29._8_4_ = 0x7fffffff;
      auVar29._0_8_ = 0x7fffffff7fffffff;
      auVar29._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx(auVar29,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar25._8_4_ = 0x219392ef;
      auVar25._0_8_ = 0x219392ef219392ef;
      auVar25._12_4_ = 0x219392ef;
      uVar11 = vcmpps_avx512vl(auVar27,auVar25,1);
      bVar22 = (bool)((byte)uVar11 & 1);
      auVar26._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._0_4_;
      bVar22 = (bool)((byte)(uVar11 >> 1) & 1);
      auVar26._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._4_4_;
      bVar22 = (bool)((byte)(uVar11 >> 2) & 1);
      auVar26._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._8_4_;
      bVar22 = (bool)((byte)(uVar11 >> 3) & 1);
      auVar26._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._12_4_;
      auVar27 = vandps_avx(auVar29,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      uVar11 = vcmpps_avx512vl(auVar27,auVar25,1);
      bVar22 = (bool)((byte)uVar11 & 1);
      auVar31._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._16_4_;
      bVar22 = (bool)((byte)(uVar11 >> 1) & 1);
      auVar31._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._20_4_;
      bVar22 = (bool)((byte)(uVar11 >> 2) & 1);
      auVar31._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._24_4_;
      bVar22 = (bool)((byte)(uVar11 >> 3) & 1);
      auVar31._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._28_4_;
      auVar27 = vandps_avx(auVar29,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      uVar11 = vcmpps_avx512vl(auVar27,auVar25,1);
      bVar22 = (bool)((byte)uVar11 & 1);
      auVar32._0_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._32_4_;
      bVar22 = (bool)((byte)(uVar11 >> 1) & 1);
      auVar32._4_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._36_4_;
      bVar22 = (bool)((byte)(uVar11 >> 2) & 1);
      auVar32._8_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._40_4_;
      bVar22 = (bool)((byte)(uVar11 >> 3) & 1);
      auVar32._12_4_ = (uint)bVar22 * 0x219392ef | (uint)!bVar22 * tray.dir.field_0._44_4_;
      auVar25 = vrcp14ps_avx512vl(auVar26);
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar27 = vfnmadd213ps_fma(auVar26,auVar25,auVar28);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar27,auVar25,auVar25)
      ;
      auVar26 = vrcp14ps_avx512vl(auVar31);
      auVar27 = vfnmadd213ps_fma(auVar31,auVar26,auVar28);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar27,auVar26,auVar26)
      ;
      auVar26 = vrcp14ps_avx512vl(auVar32);
      auVar27 = vfnmadd213ps_fma(auVar32,auVar26,auVar28);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar27,auVar26,auVar26)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      uVar11 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar47,1);
      auVar27 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar27._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar11 & 1) * auVar27._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar27._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar27._12_4_;
      uVar11 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar47,5);
      auVar27 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar22 = (bool)((byte)uVar11 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar22 * auVar27._0_4_ | (uint)!bVar22 * 0x60;
      bVar22 = (bool)((byte)(uVar11 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar22 * auVar27._4_4_ | (uint)!bVar22 * 0x60;
      bVar22 = (bool)((byte)(uVar11 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar22 * auVar27._8_4_ | (uint)!bVar22 * 0x60;
      bVar22 = (bool)((byte)(uVar11 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar22 * auVar27._12_4_ | (uint)!bVar22 * 0x60;
      uVar11 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar47,5);
      auVar27 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar22 = (bool)((byte)uVar11 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar22 * auVar27._0_4_ | (uint)!bVar22 * 0xa0;
      bVar22 = (bool)((byte)(uVar11 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar22 * auVar27._4_4_ | (uint)!bVar22 * 0xa0;
      bVar22 = (bool)((byte)(uVar11 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar22 * auVar27._8_4_ | (uint)!bVar22 * 0xa0;
      bVar22 = (bool)((byte)(uVar11 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar22 * auVar27._12_4_ | (uint)!bVar22 * 0xa0;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar52 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar27 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar47);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar23 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar23 & 1) * 0x7f800000;
      bVar22 = (bool)((byte)(uVar24 >> 1) & 1);
      tray.tnear.field_0._4_4_ = (uint)bVar22 * auVar27._4_4_ | (uint)!bVar22 * 0x7f800000;
      bVar22 = (bool)((byte)(uVar24 >> 2) & 1);
      tray.tnear.field_0._8_4_ = (uint)bVar22 * auVar27._8_4_ | (uint)!bVar22 * 0x7f800000;
      bVar22 = SUB81(uVar24 >> 3,0);
      tray.tnear.field_0._12_4_ = (uint)bVar22 * auVar27._12_4_ | (uint)!bVar22 * 0x7f800000;
      auVar27 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar47);
      tray.tfar.field_0.i[0] =
           (uint)(bVar23 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar23 & 1) * -0x800000;
      bVar22 = (bool)((byte)(uVar24 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar22 * auVar27._4_4_ | (uint)!bVar22 * -0x800000;
      bVar22 = (bool)((byte)(uVar24 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar22 * auVar27._8_4_ | (uint)!bVar22 * -0x800000;
      bVar22 = SUB81(uVar24 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar22 * auVar27._12_4_ | (uint)!bVar22 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar21 = 3;
      }
      else {
        uVar21 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      bVar19 = (byte)((ushort)((short)uVar24 << 0xc) >> 0xc) ^ 0xf;
      pNVar20 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar12 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00768b9e:
      do {
        do {
          root.ptr = pNVar20[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0076932a;
          pNVar20 = pNVar20 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar12[-1].v;
          auVar48 = ZEXT1664((undefined1  [16])vVar2.field_0);
          paVar12 = paVar12 + -1;
          uVar24 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar24 == '\0');
        uVar9 = (undefined4)uVar24;
        if (uVar21 < (uint)POPCOUNT(uVar9)) {
LAB_00768bdb:
          do {
            iVar44 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0076932a;
              uVar6 = vcmpps_avx512vl((undefined1  [16])tray.tfar.field_0,auVar48._0_16_,6);
              if ((char)uVar6 == '\0') goto LAB_00768b9e;
              uVar24 = (ulong)((uint)root.ptr & 0xf);
              bVar8 = bVar19 & 0xf;
              if (uVar24 == 8) goto LAB_00769230;
              bVar8 = bVar8 ^ 0xf;
              auVar27 = *(undefined1 (*) [16])(ray + 0x50);
              auVar47 = *(undefined1 (*) [16])(ray + 0x60);
              auVar26 = *(undefined1 (*) [16])(ray + 0x40);
              lVar10 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar11 = 0;
              goto LAB_00768ddb;
            }
            lVar10 = 0;
            sVar14 = 8;
            auVar27 = auVar52._0_16_;
            do {
              sVar13 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar10 * 8);
              if (sVar13 == 8) {
                auVar48 = ZEXT1664(auVar27);
                sVar13 = sVar14;
                break;
              }
              uVar9 = *(undefined4 *)(root.ptr + 0x40 + lVar10 * 4);
              auVar43._4_4_ = uVar9;
              auVar43._0_4_ = uVar9;
              auVar43._8_4_ = uVar9;
              auVar43._12_4_ = uVar9;
              auVar31 = vfmsub132ps_fma(auVar43,(undefined1  [16])
                                                tray.org_rdir.field_0.field_0.x.field_0,
                                        (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
              auVar41._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar41._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar41._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar41._12_4_ = tray.org_rdir.field_0._28_4_;
              uVar9 = *(undefined4 *)(root.ptr + 0x80 + lVar10 * 4);
              auVar49._4_4_ = uVar9;
              auVar49._0_4_ = uVar9;
              auVar49._8_4_ = uVar9;
              auVar49._12_4_ = uVar9;
              auVar42._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar42._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar42._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar42._12_4_ = tray.org_rdir.field_0._44_4_;
              uVar9 = *(undefined4 *)(root.ptr + 0xc0 + lVar10 * 4);
              auVar50._4_4_ = uVar9;
              auVar50._0_4_ = uVar9;
              auVar50._8_4_ = uVar9;
              auVar50._12_4_ = uVar9;
              auVar32 = vfmsub132ps_fma(auVar49,auVar41,
                                        (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
              auVar25 = vfmsub132ps_fma(auVar50,auVar42,
                                        (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
              uVar9 = *(undefined4 *)(root.ptr + 0x60 + lVar10 * 4);
              auVar47._4_4_ = uVar9;
              auVar47._0_4_ = uVar9;
              auVar47._8_4_ = uVar9;
              auVar47._12_4_ = uVar9;
              auVar28 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,
                                   (undefined1  [16])tray.org_rdir.field_0.field_0.x.field_0,auVar47
                                  );
              uVar9 = *(undefined4 *)(root.ptr + 0xa0 + lVar10 * 4);
              auVar38._4_4_ = uVar9;
              auVar38._0_4_ = uVar9;
              auVar38._8_4_ = uVar9;
              auVar38._12_4_ = uVar9;
              auVar29 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar41,
                                   auVar38);
              uVar9 = *(undefined4 *)(root.ptr + 0xe0 + lVar10 * 4);
              auVar39._4_4_ = uVar9;
              auVar39._0_4_ = uVar9;
              auVar39._8_4_ = uVar9;
              auVar39._12_4_ = uVar9;
              auVar30 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar42,
                                   auVar39);
              auVar47 = vpminsd_avx(auVar31,auVar28);
              auVar26 = vpminsd_avx(auVar32,auVar29);
              auVar47 = vpmaxsd_avx(auVar47,auVar26);
              auVar26 = vpminsd_avx(auVar25,auVar30);
              auVar47 = vpmaxsd_avx(auVar47,auVar26);
              auVar26 = vpmaxsd_avx(auVar31,auVar28);
              auVar31 = vpmaxsd_avx(auVar32,auVar29);
              auVar31 = vpminsd_avx(auVar26,auVar31);
              auVar26 = vpmaxsd_avx(auVar25,auVar30);
              auVar31 = vpminsd_avx(auVar31,auVar26);
              auVar26 = vpmaxsd_avx(auVar47,(undefined1  [16])tray.tnear.field_0);
              auVar31 = vpminsd_avx(auVar31,(undefined1  [16])tray.tfar.field_0);
              uVar24 = vpcmpd_avx512vl(auVar26,auVar31,2);
              uVar24 = uVar24 & 0xf;
              if ((byte)uVar24 == 0) {
                auVar48 = ZEXT1664(auVar27);
                sVar13 = sVar14;
              }
              else {
                auVar26 = vblendmps_avx512vl(auVar52._0_16_,auVar47);
                bVar22 = (bool)((byte)uVar24 & 1);
                bVar3 = (bool)((byte)(uVar24 >> 1) & 1);
                bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
                bVar5 = SUB81(uVar24 >> 3,0);
                auVar48 = ZEXT1664(CONCAT412((uint)bVar5 * auVar26._12_4_ |
                                             (uint)!bVar5 * auVar47._12_4_,
                                             CONCAT48((uint)bVar4 * auVar26._8_4_ |
                                                      (uint)!bVar4 * auVar47._8_4_,
                                                      CONCAT44((uint)bVar3 * auVar26._4_4_ |
                                                               (uint)!bVar3 * auVar47._4_4_,
                                                               (uint)bVar22 * auVar26._0_4_ |
                                                               (uint)!bVar22 * auVar47._0_4_))));
                if (sVar14 != 8) {
                  pNVar20->ptr = sVar14;
                  pNVar20 = pNVar20 + 1;
                  *(undefined1 (*) [16])paVar12->v = auVar27;
                  paVar12 = paVar12 + 1;
                }
              }
              lVar10 = lVar10 + 1;
              auVar27 = auVar48._0_16_;
              sVar14 = sVar13;
            } while (lVar10 != 8);
            if (sVar13 == 8) goto LAB_00768d45;
            uVar6 = vcmpps_avx512vl((undefined1  [16])auVar48._0_16_,
                                    (undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar13;
          } while ((byte)uVar21 < (byte)POPCOUNT((int)uVar6));
          pNVar20->ptr = sVar13;
          pNVar20 = pNVar20 + 1;
          *paVar12 = auVar48._0_16_;
          paVar12 = paVar12 + 1;
        }
        else {
          do {
            sVar14 = 0;
            for (uVar11 = uVar24; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
              sVar14 = sVar14 + 1;
            }
            bVar22 = occluded1(This,bvh,root,sVar14,&pre,ray,&tray,context);
            bVar8 = (byte)(1 << ((uint)sVar14 & 0x1f));
            if (!bVar22) {
              bVar8 = 0;
            }
            bVar19 = bVar19 | bVar8;
            uVar24 = uVar24 - 1 & uVar24;
          } while (uVar24 != 0);
          iVar44 = 3;
          if (bVar19 != 0xf) {
            auVar27 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar22 = (bool)(bVar19 >> 1 & 1);
            bVar3 = (bool)(bVar19 >> 2 & 1);
            bVar4 = (bool)(bVar19 >> 3 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar22 * auVar27._4_4_ | (uint)!bVar22 * tray.tfar.field_0.i[1];
            tray.tfar.field_0.i[0] =
                 (uint)(bVar19 & 1) * auVar27._0_4_ |
                 (uint)!(bool)(bVar19 & 1) * tray.tfar.field_0.i[0];
            tray.tfar.field_0.i[2] =
                 (uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * tray.tfar.field_0.i[2];
            tray.tfar.field_0.i[3] =
                 (uint)bVar4 * auVar27._12_4_ | (uint)!bVar4 * tray.tfar.field_0.i[3];
            iVar44 = 2;
          }
          auVar52 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar48 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if (uVar21 < (uint)POPCOUNT(uVar9)) goto LAB_00768bdb;
        }
LAB_00768d45:
      } while (iVar44 != 3);
LAB_0076932a:
      bVar19 = bVar19 & bVar23;
      bVar22 = (bool)(bVar19 >> 1 & 1);
      bVar3 = (bool)(bVar19 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar19 & 1) * -0x800000 | (uint)!(bool)(bVar19 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar22 * -0x800000 | (uint)!bVar22 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar19 >> 3) * -0x800000 | (uint)!(bool)(bVar19 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
  while( true ) {
    uVar11 = uVar11 + 1;
    lVar10 = lVar10 + 0xe0;
    if (uVar24 - 8 <= uVar11) break;
LAB_00768ddb:
    uVar15 = 0;
    bVar18 = bVar8;
    while (uVar16 = (ulong)*(uint *)(lVar10 + uVar15 * 4), uVar16 != 0xffffffff) {
      auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar10 + -0xc0 + uVar15 * 4)));
      auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar10 + -0xb0 + uVar15 * 4)));
      auVar25 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar10 + -0xa0 + uVar15 * 4)));
      uVar9 = *(undefined4 *)(lVar10 + -0x90 + uVar15 * 4);
      auVar51._4_4_ = uVar9;
      auVar51._0_4_ = uVar9;
      auVar51._8_4_ = uVar9;
      auVar51._12_4_ = uVar9;
      uVar9 = *(undefined4 *)(lVar10 + -0x80 + uVar15 * 4);
      auVar53._4_4_ = uVar9;
      auVar53._0_4_ = uVar9;
      auVar53._8_4_ = uVar9;
      auVar53._12_4_ = uVar9;
      uVar9 = *(undefined4 *)(lVar10 + -0x70 + uVar15 * 4);
      auVar54._4_4_ = uVar9;
      auVar54._0_4_ = uVar9;
      auVar54._8_4_ = uVar9;
      auVar54._12_4_ = uVar9;
      uVar9 = *(undefined4 *)(lVar10 + -0x30 + uVar15 * 4);
      auVar55._4_4_ = uVar9;
      auVar55._0_4_ = uVar9;
      auVar55._8_4_ = uVar9;
      auVar55._12_4_ = uVar9;
      uVar9 = *(undefined4 *)(lVar10 + -0x20 + uVar15 * 4);
      auVar57._4_4_ = uVar9;
      auVar57._0_4_ = uVar9;
      auVar57._8_4_ = uVar9;
      auVar57._12_4_ = uVar9;
      uVar9 = *(undefined4 *)(lVar10 + -0x10 + uVar15 * 4);
      auVar58._4_4_ = uVar9;
      auVar58._0_4_ = uVar9;
      auVar58._8_4_ = uVar9;
      auVar58._12_4_ = uVar9;
      auVar28 = vsubss_avx512f(auVar31,auVar51);
      auVar29 = vbroadcastss_avx512vl(auVar28);
      auVar30 = vsubss_avx512f(auVar32,auVar53);
      auVar33 = vbroadcastss_avx512vl(auVar30);
      auVar34 = vsubss_avx512f(auVar25,auVar54);
      auVar35 = vbroadcastss_avx512vl(auVar34);
      auVar36 = vsubss_avx512f(auVar55,auVar31);
      auVar37 = vbroadcastss_avx512vl(auVar36);
      auVar38 = vsubss_avx512f(auVar57,auVar32);
      auVar39 = vbroadcastss_avx512vl(auVar38);
      auVar40 = vsubss_avx512f(auVar58,auVar25);
      auVar41 = vbroadcastss_avx512vl(auVar40);
      auVar30 = vmulss_avx512f(auVar30,auVar40);
      auVar30 = vbroadcastss_avx512vl(auVar30);
      auVar40 = vfmsub231ps_avx512vl(auVar30,auVar39,auVar35);
      auVar30 = vmulss_avx512f(auVar34,auVar36);
      auVar30 = vbroadcastss_avx512vl(auVar30);
      auVar34 = vfmsub231ps_avx512vl(auVar30,auVar41,auVar29);
      auVar28 = vmulss_avx512f(auVar28,auVar38);
      auVar28 = vbroadcastss_avx512vl(auVar28);
      auVar28 = vfmsub231ps_avx512vl(auVar28,auVar37,auVar33);
      auVar31 = vsubps_avx512vl(auVar31,*(undefined1 (*) [16])ray);
      auVar32 = vsubps_avx512vl(auVar32,*(undefined1 (*) [16])(ray + 0x10));
      auVar25 = vsubps_avx512vl(auVar25,*(undefined1 (*) [16])(ray + 0x20));
      auVar30 = vmulps_avx512vl(auVar27,auVar25);
      auVar36 = vfmsub231ps_avx512vl(auVar30,auVar32,auVar47);
      auVar30 = vmulps_avx512vl(auVar47,auVar31);
      auVar38 = vfmsub231ps_avx512vl(auVar30,auVar25,auVar26);
      auVar30 = vmulps_avx512vl(auVar26,auVar32);
      auVar42 = vfmsub231ps_avx512vl(auVar30,auVar31,auVar27);
      auVar30 = vmulps_avx512vl(auVar28,auVar47);
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar34,auVar27);
      auVar43 = vfmadd231ps_avx512vl(auVar30,auVar40,auVar26);
      auVar30._8_4_ = 0x80000000;
      auVar30._0_8_ = 0x8000000080000000;
      auVar30._12_4_ = 0x80000000;
      auVar30 = vandps_avx512vl(auVar43,auVar30);
      auVar41 = vmulps_avx512vl(auVar41,auVar42);
      auVar39 = vfmadd231ps_avx512vl(auVar41,auVar38,auVar39);
      auVar37 = vfmadd231ps_avx512vl(auVar39,auVar36,auVar37);
      auVar37 = vxorps_avx512vl(auVar30,auVar37);
      uVar6 = vcmpps_avx512vl(auVar37,_DAT_01f7aa10,5);
      bVar17 = (byte)uVar6 & bVar18;
      if (bVar17 != 0) {
        auVar35 = vmulps_avx512vl(auVar35,auVar42);
        auVar33 = vfmadd213ps_avx512vl(auVar33,auVar38,auVar35);
        auVar29 = vfmadd213ps_avx512vl(auVar29,auVar36,auVar33);
        auVar29 = vxorps_avx512vl(auVar30,auVar29);
        uVar6 = vcmpps_avx512vl(auVar29,_DAT_01f7aa10,5);
        bVar17 = bVar17 & (byte)uVar6;
        if (bVar17 != 0) {
          auVar33._8_4_ = 0x7fffffff;
          auVar33._0_8_ = 0x7fffffff7fffffff;
          auVar33._12_4_ = 0x7fffffff;
          auVar33 = vandps_avx512vl(auVar43,auVar33);
          auVar35 = vsubps_avx512vl(auVar33,auVar37);
          uVar6 = vcmpps_avx512vl(auVar35,auVar29,5);
          bVar17 = bVar17 & (byte)uVar6;
          if (bVar17 != 0) {
            auVar25 = vmulps_avx512vl(auVar28,auVar25);
            auVar32 = vfmadd213ps_avx512vl(auVar32,auVar34,auVar25);
            auVar31 = vfmadd213ps_avx512vl(auVar31,auVar40,auVar32);
            auVar31 = vxorps_avx512vl(auVar30,auVar31);
            auVar32 = vmulps_avx512vl(auVar33,*(undefined1 (*) [16])(ray + 0x30));
            auVar25 = vmulps_avx512vl(auVar33,*(undefined1 (*) [16])(ray + 0x80));
            uVar6 = vcmpps_avx512vl(auVar31,auVar25,2);
            uVar7 = vcmpps_avx512vl(auVar32,auVar31,1);
            bVar17 = bVar17 & (byte)uVar6 & (byte)uVar7;
            if (bVar17 != 0) {
              uVar6 = vcmpps_avx512vl(auVar43,_DAT_01f7aa10,4);
              bVar17 = bVar17 & (byte)uVar6;
              if (bVar17 != 0) {
                uVar1 = ((context->scene->geometries).items[uVar16].ptr)->mask;
                auVar34._4_4_ = uVar1;
                auVar34._0_4_ = uVar1;
                auVar34._8_4_ = uVar1;
                auVar34._12_4_ = uVar1;
                uVar6 = vptestmd_avx512vl(*(undefined1 (*) [16])(ray + 0x90),auVar34);
                bVar17 = bVar17 & (byte)uVar6 & 0xf;
                if (bVar17 != 0) {
                  bVar18 = (bVar17 ^ 0xf) & bVar18;
                }
              }
            }
          }
        }
      }
      if (bVar18 == 0) {
        bVar18 = 0;
        auVar52 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        break;
      }
      uVar9 = *(undefined4 *)(lVar10 + -0x60 + uVar15 * 4);
      auVar40._4_4_ = uVar9;
      auVar40._0_4_ = uVar9;
      auVar40._8_4_ = uVar9;
      auVar40._12_4_ = uVar9;
      auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar10 + -0x50 + uVar15 * 4)));
      auVar25 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar10 + -0x40 + uVar15 * 4)));
      auVar28 = vsubps_avx512vl(auVar40,auVar55);
      auVar29 = vsubps_avx512vl(auVar32,auVar57);
      auVar30 = vsubps_avx512vl(auVar25,auVar58);
      auVar33 = vsubps_avx512vl(auVar51,auVar40);
      auVar34 = vsubps_avx512vl(auVar53,auVar32);
      auVar36 = vsubps_avx512vl(auVar54,auVar25);
      auVar31 = vmulps_avx512vl(auVar29,auVar36);
      auVar37 = vfmsub231ps_avx512vl(auVar31,auVar34,auVar30);
      auVar31 = vmulps_avx512vl(auVar30,auVar33);
      auVar38 = vfmsub231ps_avx512vl(auVar31,auVar36,auVar28);
      auVar31 = vmulps_avx512vl(auVar28,auVar34);
      auVar39 = vfmsub231ps_avx512vl(auVar31,auVar33,auVar29);
      auVar31 = vsubps_avx(auVar40,*(undefined1 (*) [16])ray);
      auVar40 = vsubps_avx512vl(auVar32,*(undefined1 (*) [16])(ray + 0x10));
      auVar25 = vsubps_avx512vl(auVar25,*(undefined1 (*) [16])(ray + 0x20));
      auVar32 = vmulps_avx512vl(auVar27,auVar25);
      auVar41 = vfmsub231ps_avx512vl(auVar32,auVar40,auVar47);
      auVar32 = vmulps_avx512vl(auVar47,auVar31);
      auVar42 = vfmsub231ps_avx512vl(auVar32,auVar25,auVar26);
      auVar32 = vmulps_avx512vl(auVar26,auVar40);
      auVar43 = vfmsub231ps_avx512vl(auVar32,auVar31,auVar27);
      auVar56._0_4_ = auVar39._0_4_ * auVar47._0_4_;
      auVar56._4_4_ = auVar39._4_4_ * auVar47._4_4_;
      auVar56._8_4_ = auVar39._8_4_ * auVar47._8_4_;
      auVar56._12_4_ = auVar39._12_4_ * auVar47._12_4_;
      auVar32 = vfmadd231ps_fma(auVar56,auVar38,auVar27);
      auVar32 = vfmadd231ps_fma(auVar32,auVar37,auVar26);
      auVar35._8_4_ = 0x80000000;
      auVar35._0_8_ = 0x8000000080000000;
      auVar35._12_4_ = 0x80000000;
      auVar35 = vandps_avx512vl(auVar32,auVar35);
      auVar36 = vmulps_avx512vl(auVar36,auVar43);
      auVar34 = vfmadd231ps_avx512vl(auVar36,auVar42,auVar34);
      auVar33 = vfmadd231ps_avx512vl(auVar34,auVar41,auVar33);
      auVar33 = vxorps_avx512vl(auVar35,auVar33);
      uVar6 = vcmpps_avx512vl(auVar33,_DAT_01f7aa10,5);
      bVar17 = (byte)uVar6 & bVar18;
      if (bVar17 != 0) {
        auVar30 = vmulps_avx512vl(auVar30,auVar43);
        auVar29 = vfmadd213ps_avx512vl(auVar29,auVar42,auVar30);
        auVar28 = vfmadd213ps_avx512vl(auVar28,auVar41,auVar29);
        auVar28 = vxorps_avx512vl(auVar35,auVar28);
        uVar6 = vcmpps_avx512vl(auVar28,_DAT_01f7aa10,5);
        bVar17 = bVar17 & (byte)uVar6;
        if (bVar17 != 0) {
          auVar36._8_4_ = 0x7fffffff;
          auVar36._0_8_ = 0x7fffffff7fffffff;
          auVar36._12_4_ = 0x7fffffff;
          auVar29 = vandps_avx512vl(auVar32,auVar36);
          auVar30 = vsubps_avx512vl(auVar29,auVar33);
          uVar6 = vcmpps_avx512vl(auVar30,auVar28,5);
          bVar17 = bVar17 & (byte)uVar6;
          if (bVar17 != 0) {
            auVar25 = vmulps_avx512vl(auVar39,auVar25);
            auVar25 = vfmadd213ps_fma(auVar40,auVar38,auVar25);
            auVar31 = vfmadd213ps_fma(auVar31,auVar37,auVar25);
            auVar31 = vxorps_avx512vl(auVar35,auVar31);
            auVar25 = vmulps_avx512vl(auVar29,*(undefined1 (*) [16])(ray + 0x30));
            auVar28 = vmulps_avx512vl(auVar29,*(undefined1 (*) [16])(ray + 0x80));
            uVar6 = vcmpps_avx512vl(auVar31,auVar28,2);
            uVar7 = vcmpps_avx512vl(auVar25,auVar31,1);
            bVar17 = bVar17 & (byte)uVar6 & (byte)uVar7;
            if (bVar17 != 0) {
              uVar6 = vcmpps_avx512vl(auVar32,_DAT_01f7aa10,4);
              bVar17 = bVar17 & (byte)uVar6;
              if (bVar17 != 0) {
                uVar1 = ((context->scene->geometries).items[uVar16].ptr)->mask;
                auVar37._4_4_ = uVar1;
                auVar37._0_4_ = uVar1;
                auVar37._8_4_ = uVar1;
                auVar37._12_4_ = uVar1;
                uVar6 = vptestmd_avx512vl(*(undefined1 (*) [16])(ray + 0x90),auVar37);
                bVar17 = bVar17 & (byte)uVar6 & 0xf;
                if (bVar17 != 0) {
                  bVar18 = (bVar17 ^ 0xf) & bVar18;
                }
              }
            }
          }
        }
      }
      auVar52 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      if ((bVar18 == 0) || (bVar22 = 2 < uVar15, uVar15 = uVar15 + 1, bVar22)) break;
    }
    bVar8 = bVar8 & bVar18;
    if (bVar8 == 0) break;
  }
  bVar8 = bVar8 ^ 0xf;
LAB_00769230:
  bVar19 = bVar19 | bVar8;
  if (bVar19 == 0xf) {
    bVar19 = 0xf;
    goto LAB_0076932a;
  }
  auVar27 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  iVar44 = tray.tfar.field_0._0_4_;
  bVar22 = (bool)(bVar19 >> 1 & 1);
  bVar3 = (bool)(bVar19 >> 2 & 1);
  iVar45 = tray.tfar.field_0._8_4_;
  bVar4 = (bool)(bVar19 >> 3 & 1);
  iVar46 = tray.tfar.field_0._12_4_;
  tray.tfar.field_0.i[1] = (uint)bVar22 * auVar27._4_4_ | (uint)!bVar22 * tray.tfar.field_0._4_4_;
  tray.tfar.field_0.i[0] = (uint)(bVar19 & 1) * auVar27._0_4_ | (uint)!(bool)(bVar19 & 1) * iVar44;
  tray.tfar.field_0.i[2] = (uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * iVar45;
  tray.tfar.field_0.i[3] = (uint)bVar4 * auVar27._12_4_ | (uint)!bVar4 * iVar46;
  goto LAB_00768b9e;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }